

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void putbyte(int offset,int data)

{
  int iVar1;
  long lVar2;
  
  iVar1 = bank;
  lVar2 = (long)bank;
  if (offset < 0x2000 && lVar2 < 0xf0) {
    rom[lVar2][offset] = (uchar)data;
    map[lVar2][offset] = (char)(page << 5) + (char)section;
    if (max_bank < iVar1) {
      max_bank = iVar1;
    }
  }
  return;
}

Assistant:

void
putbyte(int offset, int data)
{
	if (bank >= RESERVED_BANK)
		return;
	if (offset < 0x2000) {
		rom[bank][offset] = (data) & 0xFF;
		map[bank][offset] = section + (page << 5);

		/* update rom size */
		if (bank > max_bank)
			max_bank = bank;
	}
}